

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O1

PVG_FT_Error PVG_FT_Stroker_EndSubPath(PVG_FT_Stroker stroker)

{
  int iVar1;
  PVG_FT_Pos PVar2;
  PVG_FT_Vector *pPVar3;
  PVG_FT_Angle PVar4;
  PVG_FT_Vector *pPVar5;
  PVG_FT_Int in_EDX;
  PVG_FT_Int extraout_EDX;
  PVG_FT_Int side;
  PVG_FT_Vector *pPVar6;
  PVG_FT_UInt new_points;
  PVG_FT_Bool reverse;
  ulong uVar7;
  byte *pbVar8;
  PVG_FT_UInt PVar9;
  PVG_FT_StrokeBorder border;
  uint uVar10;
  
  if (stroker->subpath_open == '\0') {
    if (((stroker->center).x != (stroker->subpath_start).x) ||
       ((stroker->center).y != (stroker->subpath_start).y)) {
      PVG_FT_Stroker_LineTo(stroker,&stroker->subpath_start);
    }
    stroker->angle_out = stroker->subpath_angle;
    PVar4 = PVG_FT_Angle_Diff(stroker->angle_in,stroker->subpath_angle);
    if (PVar4 != 0) {
      uVar10 = (uint)((ulong)PVar4 >> 0x3f);
      ft_stroker_inside(stroker,uVar10,stroker->subpath_line_length);
      ft_stroker_outside(stroker,uVar10 ^ 1,stroker->subpath_line_length);
    }
    ft_stroke_border_close(stroker->borders,'\0');
    border = stroker->borders + 1;
    reverse = '\x01';
  }
  else {
    ft_stroker_cap(stroker,stroker->angle_in,in_EDX);
    iVar1 = stroker->borders[1].start;
    if (iVar1 < 0) {
      __assert_fail("left->start >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-ft-stroker.c"
                    ,0x5dc,"PVG_FT_Error ft_stroker_add_reverse_left(PVG_FT_Stroker, PVG_FT_Bool)");
    }
    border = stroker->borders;
    new_points = stroker->borders[1].num_points - iVar1;
    side = extraout_EDX;
    if (0 < (int)new_points) {
      ft_stroke_border_grow(border,new_points);
      pPVar6 = stroker->borders[1].points;
      uVar7 = (ulong)stroker->borders[1].num_points;
      pPVar3 = pPVar6 + (uVar7 - 1);
      PVar9 = stroker->borders[1].start;
      pPVar6 = pPVar6 + (int)PVar9;
      if (pPVar6 <= pPVar3) {
        uVar10 = stroker->borders[0].num_points;
        pPVar6 = (PVG_FT_Vector *)(stroker->borders[0].tags + uVar10);
        pPVar5 = stroker->borders[0].points + uVar10;
        pbVar8 = stroker->borders[1].tags + uVar7;
        do {
          pbVar8 = pbVar8 + -1;
          PVar2 = pPVar3->y;
          pPVar5->x = pPVar3->x;
          pPVar5->y = PVar2;
          *(byte *)&pPVar6->x = *pbVar8 & 0xf3;
          pPVar5 = pPVar5 + 1;
          pPVar6 = (PVG_FT_Vector *)((long)&pPVar6->x + 1);
          pPVar3 = pPVar3 + -1;
          PVar9 = stroker->borders[1].start;
        } while (stroker->borders[1].points + (int)PVar9 <= pPVar3);
      }
      side = (PVG_FT_Int)pPVar6;
      stroker->borders[1].num_points = PVar9;
      stroker->borders[0].num_points = stroker->borders[0].num_points + new_points;
      stroker->borders[0].movable = '\0';
      stroker->borders[1].movable = '\0';
    }
    PVar2 = (stroker->subpath_start).y;
    (stroker->center).x = (stroker->subpath_start).x;
    (stroker->center).y = PVar2;
    ft_stroker_cap(stroker,stroker->subpath_angle + 0xb40000,side);
    reverse = '\0';
  }
  ft_stroke_border_close(border,reverse);
  return 0;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_EndSubPath(PVG_FT_Stroker stroker)
{
    PVG_FT_Error error = 0;

    if (stroker->subpath_open) {
        PVG_FT_StrokeBorder right = stroker->borders;

        /* All right, this is an opened path, we need to add a cap between */
        /* right & left, add the reverse of left, then add a final cap     */
        /* between left & right.                                           */
        error = ft_stroker_cap(stroker, stroker->angle_in, 0);
        if (error) goto Exit;

        /* add reversed points from `left' to `right' */
        error = ft_stroker_add_reverse_left(stroker, TRUE);
        if (error) goto Exit;

        /* now add the final cap */
        stroker->center = stroker->subpath_start;
        error =
            ft_stroker_cap(stroker, stroker->subpath_angle + PVG_FT_ANGLE_PI, 0);
        if (error) goto Exit;

        /* Now end the right subpath accordingly.  The left one is */
        /* rewind and doesn't need further processing.             */
        ft_stroke_border_close(right, FALSE);
    } else {
        PVG_FT_Angle turn;
        PVG_FT_Int   inside_side;

        /* close the path if needed */
        if (stroker->center.x != stroker->subpath_start.x ||
            stroker->center.y != stroker->subpath_start.y) {
            error = PVG_FT_Stroker_LineTo(stroker, &stroker->subpath_start);
            if (error) goto Exit;
        }

        /* process the corner */
        stroker->angle_out = stroker->subpath_angle;
        turn = PVG_FT_Angle_Diff(stroker->angle_in, stroker->angle_out);

        /* no specific corner processing is required if the turn is 0 */
        if (turn != 0) {
            /* when we turn to the right, the inside side is 0 */
            inside_side = 0;

            /* otherwise, the inside side is 1 */
            if (turn < 0) inside_side = 1;

            error = ft_stroker_inside(stroker, inside_side,
                                      stroker->subpath_line_length);
            if (error) goto Exit;

            /* process the outside side */
            error = ft_stroker_outside(stroker, 1 - inside_side,
                                       stroker->subpath_line_length);
            if (error) goto Exit;
        }

        /* then end our two subpaths */
        ft_stroke_border_close(stroker->borders + 0, FALSE);
        ft_stroke_border_close(stroker->borders + 1, TRUE);
    }

Exit:
    return error;
}